

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_strtoi(char *str,char **endptr)

{
  int iVar1;
  int iVar2;
  char cVar3;
  
  if (str != (char *)0x0) {
    for (; *str == ' '; str = str + 1) {
    }
    if (*str == '-') {
      str = str + 1;
      iVar2 = -1;
    }
    else {
      iVar2 = 1;
    }
    cVar3 = *str;
    iVar1 = 0;
    if ((byte)(cVar3 - 0x30U) < 10) {
      iVar1 = 0;
      do {
        iVar1 = (uint)(byte)(cVar3 - 0x30) + iVar1 * 10;
        cVar3 = str[1];
        str = str + 1;
      } while ((byte)(cVar3 - 0x30U) < 10);
    }
    if (endptr != (char **)0x0) {
      *endptr = str;
    }
    return iVar1 * iVar2;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x193e,"int nk_strtoi(const char *, const char **)");
}

Assistant:

NK_API int
nk_strtoi(const char *str, const char **endptr)
{
    int neg = 1;
    const char *p = str;
    int value = 0;

    NK_ASSERT(str);
    if (!str) return 0;

    /* skip whitespace */
    while (*p == ' ') p++;
    if (*p == '-') {
        neg = -1;
        p++;
    }
    while (*p && *p >= '0' && *p <= '9') {
        value = value * 10 + (int) (*p - '0');
        p++;
    }
    if (endptr)
        *endptr = p;
    return neg*value;
}